

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O1

int fy_token_iter_utf8_get(fy_token_iter *iter)

{
  size_t *psVar1;
  byte bVar2;
  byte *ptr;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint left;
  ulong uVar6;
  int w1;
  int local_14;
  
  uVar4 = iter->unget_c;
  if (uVar4 == 0xffffffff) {
    ptr = (byte *)(iter->ic).str;
    if (ptr == (byte *)0x0) {
      iVar5 = fy_atom_iter_utf8_get(&iter->atom_iter);
      return iVar5;
    }
    uVar3 = (iter->ic).len;
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      bVar2 = *ptr;
      left = 1;
      if ((char)bVar2 < '\0') {
        left = 2;
        if (((bVar2 & 0xe0) != 0xc0) && (left = 3, (bVar2 & 0xf0) != 0xe0)) {
          left = (uint)((bVar2 & 0xf8) == 0xf0) << 2;
        }
      }
      if ((left != 0) && (uVar6 = (ulong)left, uVar6 <= uVar3)) {
        if ((char)bVar2 < '\0') {
          uVar4 = fy_utf8_get_generic(ptr,left,&local_14);
        }
        else {
          uVar4 = *ptr & 0x7f;
        }
        (iter->ic).str = (iter->ic).str + uVar6;
        psVar1 = &(iter->ic).len;
        *psVar1 = *psVar1 - uVar6;
      }
    }
  }
  else {
    iter->unget_c = -1;
  }
  return uVar4;
}

Assistant:

int fy_token_iter_utf8_get(struct fy_token_iter *iter) {
    int c, w, w1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c;
    }

    /* direct */
    if (iter->ic.str) {

        /* not even 1 octet */
        if (!iter->ic.len)
            return -1;

        /* get width by the first octet */
        w = fy_utf8_width_by_first_octet((uint8_t) *iter->ic.str);
        if (!w || (unsigned int) w > iter->ic.len)
            return -1;

        /* get the next character */
        c = fy_utf8_get(iter->ic.str, w, &w1);

        iter->ic.str += w;
        iter->ic.len -= w;

        return c;
    }

    return fy_atom_iter_utf8_get(&iter->atom_iter);
}